

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_heavy.cc
# Opt level: O2

MessageLite * __thiscall
google::protobuf::internal::ExtensionSet::AddMessage
          (ExtensionSet *this,FieldDescriptor *descriptor,MessageFactory *factory)

{
  uint uVar1;
  Extension *pEVar2;
  bool bVar3;
  int iVar4;
  LogMessage *pLVar5;
  MessageLite *pMVar6;
  Type *pTVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined8 extraout_RAX;
  LogFinisher local_59;
  Extension *extension;
  LogMessage local_50;
  
  bVar3 = MaybeNewExtension(this,*(int *)(descriptor + 0x28),descriptor,&extension);
  if (bVar3) {
    uVar1 = *(uint *)(descriptor + 0x2c);
    extension->type = (FieldType)uVar1;
    if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(uVar1 & 0xff) * 4) != 10) {
      LogMessage::LogMessage
                (&local_50,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/extension_set_heavy.cc"
                 ,0xbe);
      pLVar5 = LogMessage::operator<<
                         (&local_50,
                          "CHECK failed: (cpp_type(extension->type)) == (FieldDescriptor::CPPTYPE_MESSAGE): "
                         );
      LogFinisher::operator=(&local_59,pLVar5);
      LogMessage::~LogMessage(&local_50);
    }
    pEVar2 = extension;
    extension->is_repeated = true;
    pMVar6 = (MessageLite *)operator_new(0x18);
    pMVar6->_vptr_MessageLite = (_func_int **)0x0;
    pMVar6[1]._vptr_MessageLite = (_func_int **)0x0;
    *(undefined4 *)&pMVar6[2]._vptr_MessageLite = 0;
    (pEVar2->field_0).message_value = pMVar6;
  }
  else {
    if (extension->is_repeated == false) {
      LogMessage::LogMessage
                (&local_50,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/extension_set_heavy.cc"
                 ,0xc3);
      pLVar5 = LogMessage::operator<<
                         (&local_50,
                          "CHECK failed: ((*extension).is_repeated ? FieldDescriptor::LABEL_REPEATED : FieldDescriptor::LABEL_OPTIONAL) == (FieldDescriptor::LABEL_REPEATED): "
                         );
      LogFinisher::operator=(&local_59,pLVar5);
      LogMessage::~LogMessage(&local_50);
    }
    if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)extension->type * 4) != 10) {
      LogMessage::LogMessage
                (&local_50,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/extension_set_heavy.cc"
                 ,0xc3);
      pLVar5 = LogMessage::operator<<
                         (&local_50,
                          "CHECK failed: (cpp_type((*extension).type)) == (FieldDescriptor::CPPTYPE_MESSAGE): "
                         );
      LogFinisher::operator=(&local_59,pLVar5);
      LogMessage::~LogMessage(&local_50);
    }
  }
  pTVar7 = RepeatedPtrFieldBase::
           AddFromCleared<google::protobuf::internal::GenericTypeHandler<google::protobuf::MessageLite>>
                     ((RepeatedPtrFieldBase *)(extension->field_0).string_value);
  if (pTVar7 == (Type *)0x0) {
    if (((RepeatedPtrFieldBase *)(extension->field_0).repeated_int32_value)->current_size_ == 0) {
      iVar4 = (*factory->_vptr_MessageFactory[2])(factory,*(undefined8 *)(descriptor + 0x48));
      pTVar7 = (Type *)CONCAT44(extraout_var,iVar4);
      if (pTVar7 == (Type *)0x0) {
        LogMessage::LogMessage
                  (&local_50,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/extension_set_heavy.cc"
                   ,0xce);
        pLVar5 = LogMessage::operator<<(&local_50,"CHECK failed: prototype != NULL: ");
        LogFinisher::operator=(&local_59,pLVar5);
        LogMessage::~LogMessage(&local_50);
        LogMessage::~LogMessage(&local_50);
        _Unwind_Resume(extraout_RAX);
      }
    }
    else {
      pTVar7 = RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<google::protobuf::MessageLite>::TypeHandler>
                         ((RepeatedPtrFieldBase *)(extension->field_0).repeated_int32_value,0);
    }
    iVar4 = (*pTVar7->_vptr_MessageLite[3])(pTVar7);
    pTVar7 = (Type *)CONCAT44(extraout_var_00,iVar4);
    RepeatedPtrFieldBase::
    AddAllocated<google::protobuf::RepeatedPtrField<google::protobuf::MessageLite>::TypeHandler>
              ((RepeatedPtrFieldBase *)(extension->field_0).string_value,pTVar7);
  }
  return pTVar7;
}

Assistant:

MessageLite* ExtensionSet::AddMessage(const FieldDescriptor* descriptor,
                                      MessageFactory* factory) {
  Extension* extension;
  if (MaybeNewExtension(descriptor->number(), descriptor, &extension)) {
    extension->type = descriptor->type();
    GOOGLE_DCHECK_EQ(cpp_type(extension->type), FieldDescriptor::CPPTYPE_MESSAGE);
    extension->is_repeated = true;
    extension->repeated_message_value =
      new RepeatedPtrField<MessageLite>();
  } else {
    GOOGLE_DCHECK_TYPE(*extension, REPEATED, MESSAGE);
  }

  // RepeatedPtrField<Message> does not know how to Add() since it cannot
  // allocate an abstract object, so we have to be tricky.
  MessageLite* result = extension->repeated_message_value
      ->AddFromCleared<GenericTypeHandler<MessageLite> >();
  if (result == NULL) {
    const MessageLite* prototype;
    if (extension->repeated_message_value->size() == 0) {
      prototype = factory->GetPrototype(descriptor->message_type());
      GOOGLE_CHECK(prototype != NULL);
    } else {
      prototype = &extension->repeated_message_value->Get(0);
    }
    result = prototype->New();
    extension->repeated_message_value->AddAllocated(result);
  }
  return result;
}